

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_quoted<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,string *v)

{
  char ch;
  pointer pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  
  std::operator<<(os,"\"");
  pcVar1 = (v->_M_dataplus)._M_p;
  sVar2 = v->_M_string_length;
  sVar4 = 0;
  do {
    if (sVar2 == sVar4) {
      std::operator<<(os,"\"");
      return os;
    }
    ch = pcVar1[sVar4];
    switch(ch) {
    case '\0':
      pcVar3 = "\\0";
      break;
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
switchD_00119971_caseD_1:
      write_character<std::ostream>(os,ch);
      goto LAB_00119a01;
    case '\a':
      pcVar3 = "\\a";
      break;
    case '\b':
      pcVar3 = "\\b";
      break;
    case '\t':
      pcVar3 = "\\t";
      break;
    case '\n':
      pcVar3 = "\\n";
      break;
    case '\v':
      pcVar3 = "\\v";
      break;
    case '\f':
      pcVar3 = "\\f";
      break;
    case '\r':
      pcVar3 = "\\r";
      break;
    default:
      if (ch == '\x1b') {
        pcVar3 = "\\e";
      }
      else {
        if (ch != '\"') goto switchD_00119971_caseD_1;
        pcVar3 = "\\\"";
      }
    }
    std::operator<<(os,pcVar3);
LAB_00119a01:
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

OStream & string::write_quoted (OStream & os, std::string const & v) {
            os << "\"";
            for (char const ch : v) {
                switch (ch) {
                case '\0': os << "\\0"; break;
                case '\x7': os << "\\a"; break;
                case '\x8': os << "\\b"; break;
                case '\x9': os << "\\t"; break;
                case '\xa': os << "\\n"; break;
                case '\xb': os << "\\v"; break;
                case '\xc': os << "\\f"; break;
                case '\xd': os << "\\r"; break;
                case '\x1b': os << "\\e"; break;
                case '"': os << "\\\""; break;
                default: write_character (os, ch); break;
                }
            }
            os << "\"";
            return os;
        }